

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

void __thiscall UniValue::UniValue(UniValue *this,uint64_t val_)

{
  uint64_t val__local;
  UniValue *this_local;
  
  std::__cxx11::string::string((string *)&this->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&this->values);
  ::UniValue::setInt((ulong)this);
  return;
}

Assistant:

UniValue(uint64_t val_) {
        setInt(val_);
    }